

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.cpp
# Opt level: O0

Token __thiscall slang::syntax::SyntaxNode::getLastToken(SyntaxNode *this)

{
  bool bVar1;
  SyntaxNode *pSVar2;
  Token TVar3;
  Token local_58;
  undefined1 local_48 [8];
  ConstTokenOrSyntax child;
  ptrdiff_t i;
  size_t childCount;
  SyntaxNode *this_local;
  Token result;
  
  child.super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
  super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
  super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
  super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
  super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
  super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
  super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>._16_8_ =
       getChildCount(this);
  do {
    do {
      while( true ) {
        child.super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
        _16_8_ = child.super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                 super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                 super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                 super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                 super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                 super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                 super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                 ._16_8_ - 1;
        if ((long)child.super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                  super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                  super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                  .
                  super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                  .super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                  super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                  super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                  ._16_8_ < 0) {
          parsing::Token::Token((Token *)&this_local);
          return _this_local;
        }
        getChild((ConstTokenOrSyntax *)local_48,this,
                 child.super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                 super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                 super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                 super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                 super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                 super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
                 super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                 ._16_8_);
        bVar1 = ConstTokenOrSyntax::isToken((ConstTokenOrSyntax *)local_48);
        if (!bVar1) break;
        local_58 = ConstTokenOrSyntax::token((ConstTokenOrSyntax *)local_48);
        bVar1 = parsing::Token::operator_cast_to_bool(&local_58);
        if (bVar1) {
          TVar3 = ConstTokenOrSyntax::token((ConstTokenOrSyntax *)local_48);
          return TVar3;
        }
      }
      pSVar2 = ConstTokenOrSyntax::node((ConstTokenOrSyntax *)local_48);
    } while (pSVar2 == (SyntaxNode *)0x0);
    pSVar2 = ConstTokenOrSyntax::node((ConstTokenOrSyntax *)local_48);
    _this_local = getLastToken(pSVar2);
    bVar1 = parsing::Token::operator_cast_to_bool((Token *)&this_local);
  } while (!bVar1);
  return _this_local;
}

Assistant:

parsing::Token SyntaxNode::getLastToken() const {
    size_t childCount = getChildCount();
    for (ptrdiff_t i = ptrdiff_t(childCount) - 1; i >= 0; i--) {
        auto child = getChild(size_t(i));
        if (child.isToken()) {
            if (child.token())
                return child.token();
        }
        else if (child.node()) {
            auto result = child.node()->getLastToken();
            if (result)
                return result;
        }
    }
    return Token();
}